

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasSlCrank_FSA_dns.c
# Opt level: O0

int rhsQ(sunrealtype t,N_Vector yy,N_Vector yp,N_Vector qdot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  UserData data;
  sunrealtype J2;
  sunrealtype m2;
  sunrealtype J1;
  sunrealtype v3;
  sunrealtype v2;
  sunrealtype v1;
  void *user_data_local;
  N_Vector qdot_local;
  N_Vector yp_local;
  N_Vector yy_local;
  sunrealtype t_local;
  
  dVar1 = *(double *)(*(long *)((long)yy->content + 0x10) + 0x18);
  dVar2 = *(double *)(*(long *)((long)yy->content + 0x10) + 0x20);
  dVar3 = *(double *)(*(long *)((long)yy->content + 0x10) + 0x28);
  **(double **)((long)qdot->content + 0x10) =
       (*(double *)((long)user_data + 0x10) * dVar3 * dVar3 +
       *(double *)((long)user_data + 8) * dVar1 * dVar1 +
       *(double *)((long)user_data + 0x20) * dVar2 * dVar2) * 0.5;
  return 0;
}

Assistant:

static int rhsQ(sunrealtype t, N_Vector yy, N_Vector yp, N_Vector qdot,
                void* user_data)
{
  sunrealtype v1, v2, v3;
  sunrealtype J1, m2, J2;
  UserData data;

  data = (UserData)user_data;
  J1   = data->J1;
  m2   = data->m2;
  J2   = data->J2;

  v1 = Ith(yy, 4);
  v2 = Ith(yy, 5);
  v3 = Ith(yy, 6);

  Ith(qdot, 1) = HALF * (J1 * v1 * v1 + m2 * v2 * v2 + J2 * v3 * v3);

  return (0);
}